

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool basisu::etc_block::unpack_color5
               (color_rgba *result,uint16_t packed_color5,uint16_t packed_delta3,bool scaled,
               uint32_t alpha)

{
  uint sa;
  color_rgba_i16 cVar1;
  byte in_CL;
  ushort in_SI;
  color_rgba *in_RDI;
  uint in_R8D;
  bool success;
  int r;
  int g;
  int b;
  color_rgba_i16 dc;
  uint16_t in_stack_ffffffffffffffbe;
  undefined1 local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined2 local_1c;
  undefined2 uStack_1a;
  undefined2 uStack_18;
  
  cVar1 = unpack_delta3(in_stack_ffffffffffffffbe);
  uStack_18 = cVar1.field_0._4_2_;
  local_20 = (in_SI & 0x1f) + (int)uStack_18;
  uStack_1a = cVar1.field_0._2_2_;
  local_24 = ((int)(uint)in_SI >> 5 & 0x1fU) + (int)uStack_1a;
  local_1c = cVar1.field_0._0_2_;
  local_28 = ((int)(uint)in_SI >> 10 & 0x1fU) + (int)local_1c;
  local_29 = 0x1f < (local_28 | local_24 | local_20);
  if (local_29) {
    local_28 = clamp<int>(local_28,0,0x1f);
    local_24 = clamp<int>(local_24,0,0x1f);
    local_20 = clamp<int>(local_20,0,0x1f);
  }
  local_29 = !local_29;
  if ((in_CL & 1) != 0) {
    local_20 = local_20 << 3 | (int)local_20 >> 2;
    local_24 = local_24 << 3 | (int)local_24 >> 2;
    local_28 = local_28 << 3 | (int)local_28 >> 2;
  }
  sa = minimum<unsigned_int>(in_R8D,0xff);
  color_rgba::set_noclamp_rgba(in_RDI,local_28,local_24,local_20,sa);
  return local_29;
}

Assistant:

bool etc_block::unpack_color5(color_rgba& result, uint16_t packed_color5, uint16_t packed_delta3, bool scaled, uint32_t alpha)
	{
		color_rgba_i16 dc(unpack_delta3(packed_delta3));

		int b = (packed_color5 & 31U) + dc.b;
		int g = ((packed_color5 >> 5U) & 31U) + dc.g;
		int r = ((packed_color5 >> 10U) & 31U) + dc.r;

		bool success = true;
		if (static_cast<uint32_t>(r | g | b) > 31U)
		{
			success = false;
			r = clamp<int>(r, 0, 31);
			g = clamp<int>(g, 0, 31);
			b = clamp<int>(b, 0, 31);
		}

		if (scaled)
		{
			b = (b << 3U) | (b >> 2U);
			g = (g << 3U) | (g >> 2U);
			r = (r << 3U) | (r >> 2U);
		}

		result.set_noclamp_rgba(r, g, b, minimum(alpha, 255U));
		return success;
	}